

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

FFSEncodeVector fixup_output_vector(FFSBuffer b,estate s)

{
  void *pvVar1;
  ssize_t sVar2;
  ulong uVar3;
  long lVar4;
  size_t *psVar5;
  long lVar6;
  void *pvVar7;
  FFSEncodeVector pFVar8;
  
  sVar2 = add_to_tmp_buffer(b,(long)(s->iovcnt * 0x10 + 0x50));
  if (sVar2 == -1) {
    pFVar8 = (FFSEncodeVector)0x0;
  }
  else {
    uVar3 = sVar2 + 0xfU & 0xfffffffffffffff0;
    pvVar1 = b->tmp_buffer;
    pFVar8 = (FFSEncodeVector)((long)pvVar1 + uVar3 + 0x30);
    lVar4 = (long)s->iovcnt;
    if (0 < lVar4) {
      psVar5 = &s->iovec->iov_len;
      lVar6 = 0;
      do {
        *(size_t *)((long)pvVar1 + lVar6 + uVar3 + 0x38) = *psVar5;
        pvVar7 = ((internal_iovec *)(psVar5 + -2))->iov_base;
        if (pvVar7 == (void *)0x0) {
          pvVar7 = (void *)(psVar5[-1] + (long)pvVar1);
        }
        *(void **)((long)pvVar1 + lVar6 + uVar3 + 0x30) = pvVar7;
        psVar5 = psVar5 + 3;
        lVar6 = lVar6 + 0x10;
      } while (lVar4 << 4 != lVar6);
    }
    pFVar8[lVar4].iov_base = (void *)0x0;
    pFVar8[lVar4].iov_len = 0;
    if (s->iovec_is_stack == 0) {
      free(s->iovec);
      s->iovec = (internal_iovec *)0x0;
    }
    if ((s->addr_list_is_stack == 0) && (s->addr_list != (addr_list_entry *)0x0)) {
      free(s->addr_list);
      s->addr_list = (addr_list_entry *)0x0;
    }
  }
  return pFVar8;
}

Assistant:

static FFSEncodeVector
fixup_output_vector(FFSBuffer b, estate s)
{
    int size = (s->iovcnt + 5) * sizeof(struct FFSEncodeVec);
    ssize_t tmp_vec_offset = add_to_tmp_buffer(b, size);
    FFSEncodeVector ret;
    /* buffer will not be realloc'd after this */
    int i;

    if (tmp_vec_offset == -1) return NULL;

    tmp_vec_offset += sizeof(ret[0]) - 1;
    tmp_vec_offset -= tmp_vec_offset % sizeof(ret[0]);
    ret = (FFSEncodeVector)(((char*)b->tmp_buffer) + tmp_vec_offset);
    /* leave two blanks, see notes in ffs_file.c */
    /* the upshot is that we use these if we need to add headers */
    ret += 3;
    for (i=0; i < s->iovcnt; i++) {
	ret[i].iov_len = s->iovec[i].iov_len;
	if (s->iovec[i].iov_base != NULL) {
	    ret[i].iov_base = s->iovec[i].iov_base;
	} else {
	    ret[i].iov_base = ((char*)b->tmp_buffer) + s->iovec[i].iov_offset;
	}
    }
    ret[s->iovcnt].iov_base = NULL;
    ret[s->iovcnt].iov_len = 0;
    if (!s->iovec_is_stack) {
	free(s->iovec);
	s->iovec = NULL;
    }
    if (!s->addr_list_is_stack && (s->addr_list != NULL)) {
	free(s->addr_list);
	s->addr_list = NULL;
    }
    return ret;
}